

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isojoliet_long.c
# Opt level: O1

void test_read_format_isojoliet_long(void)

{
  uint uVar1;
  int iVar2;
  wchar_t wVar3;
  mode_t mVar4;
  archive_conflict *a;
  char *pcVar5;
  la_int64_t lVar6;
  time_t tVar7;
  long lVar8;
  stat *psVar9;
  void *p;
  int64_t offset;
  size_t size;
  archive_entry *ae;
  char pathname [104];
  void *local_b8;
  longlong local_b0;
  int local_a8 [2];
  archive_entry *local_a0;
  char local_98 [100];
  undefined4 local_34;
  
  uVar1 = 1;
  lVar8 = 0;
  do {
    local_98[lVar8] = (char)(uVar1 / 10) * -10 + (char)lVar8 + '1';
    lVar8 = lVar8 + 1;
    uVar1 = uVar1 + 1;
  } while (lVar8 != 100);
  extract_reference_file("test_read_format_iso_joliet_long.iso.Z");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                   ,L'H',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'I',0,"0",(long)iVar2,"archive_read_support_filter_all(a)",(void *)0x0);
  iVar2 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'J',0,"0",(long)iVar2,"archive_read_support_format_all(a)",(void *)0x0);
  iVar2 = archive_read_set_options((archive *)a,"iso9660:!rockridge");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'L',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_read_set_options(a, \"iso9660:!rockridge\")",(void *)0x0);
  wVar3 = archive_read_open_filename(a,"test_read_format_iso_joliet_long.iso.Z",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'N',0,"ARCHIVE_OK",(long)wVar3,
                      "archive_read_open_filename(a, refname, 10240)",(void *)0x0);
  iVar2 = archive_read_next_header((archive *)a,&local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'Q',0,"0",(long)iVar2,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
             ,L'R',".","\".\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar4 = archive_entry_filetype(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'S',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  lVar6 = archive_entry_size(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'T',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0);
  tVar7 = archive_entry_mtime(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'U',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
  lVar8 = archive_entry_mtime_nsec(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'V',0,"0",lVar8,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar7 = archive_entry_ctime(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'W',0x15181,"86401",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
  psVar9 = archive_entry_stat((archive_entry_conflict *)local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'X',3,"3",psVar9->st_nlink,"archive_entry_stat(ae)->st_nlink",(void *)0x0);
  lVar6 = archive_entry_uid(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'Y',0,"0",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  iVar2 = archive_read_data_block((archive *)a,&local_b8,(size_t *)local_a8,&local_b0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'[',1,"ARCHIVE_EOF",(long)iVar2,
                      "archive_read_data_block(a, &p, &size, &offset)",a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'\\',(long)local_a8[0],"(int)size",0,"0",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L']',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar2 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'^',(long)iVar2,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  local_34 = 0x726964;
  iVar2 = archive_read_next_header((archive *)a,&local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'e',0,"0",(long)iVar2,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
             ,L'f',local_98,"pathname",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar4 = archive_entry_filetype(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'g',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  lVar6 = archive_entry_size(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'h',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0);
  tVar7 = archive_entry_mtime(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'i',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
  tVar7 = archive_entry_atime(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'j',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'k',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar2 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'l',(long)iVar2,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  local_34 = 0x333231;
  iVar2 = archive_read_next_header((archive *)a,&local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L't',0,"0",(long)iVar2,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
             ,L'u',local_98,"pathname",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar4 = archive_entry_filetype(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'v',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  pcVar5 = archive_entry_hardlink(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                   ,L'w',(uint)(pcVar5 == (char *)0x0),"archive_entry_hardlink(ae) == NULL",
                   (void *)0x0);
  lVar6 = archive_entry_size(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'x',6,"6",lVar6,"archive_entry_size(ae)",(void *)0x0);
  iVar2 = archive_read_data_block((archive *)a,&local_b8,(size_t *)local_a8,&local_b0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'y',0,"0",(long)iVar2,"archive_read_data_block(a, &p, &size, &offset)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'z',6,"6",(long)local_a8[0],"(int)size",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'{',0,"0",local_b0,"offset",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'|',local_b8,"p","hello\n","\"hello\\n\"",6,"6",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'}',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar2 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'~',(long)iVar2,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  iVar2 = archive_read_next_header((archive *)a,&local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'\x82',0,"0",(long)iVar2,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
             ,L'\x83',"hardlink","\"hardlink\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  mVar4 = archive_entry_filetype(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'\x84',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",
                      (void *)0x0);
  pcVar5 = archive_entry_hardlink(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
             ,L'\x85',local_98,"pathname",pcVar5,"archive_entry_hardlink(ae)",(void *)0x0,L'\0');
  wVar3 = archive_entry_size_is_set(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                   ,L'\x86',(uint)(wVar3 == L'\0'),"!archive_entry_size_is_set(ae)",(void *)0x0);
  wVar3 = archive_entry_is_encrypted(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'\x87',(long)wVar3,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar2 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'\x88',(long)iVar2,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  iVar2 = archive_read_next_header((archive *)a,&local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'\x8b',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",
                      (void *)0x0);
  iVar2 = archive_filter_code((archive *)a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'\x8e',(long)iVar2,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  iVar2 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'\x91',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",a);
  iVar2 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isojoliet_long.c"
                      ,L'\x92',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_isojoliet_long)
{
	const char *refname = "test_read_format_iso_joliet_long.iso.Z";
	char pathname[104];
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;
	int i;

	for (i = 0; i < 100; i++)
		pathname[i] = '0' + ((i+1) % 10); 
	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_set_options(a, "iso9660:!rockridge"));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* First entry is '.' root directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(86401, archive_entry_ctime(ae));
	assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
	assertEqualInt(0, archive_entry_uid(ae));
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 0);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A directory. */
	pathname[100] = 'd';
	pathname[101] = 'i';
	pathname[102] = 'r';
	pathname[103] = '\0';
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString(pathname, archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(86401, archive_entry_atime(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A regular file with two names (pathname gets returned
	 * first, so it's not marked as a hardlink). */
	pathname[100] = '1';
	pathname[101] = '2';
	pathname[102] = '3';
	pathname[103] = '\0';
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString(pathname, archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assert(archive_entry_hardlink(ae) == NULL);
	assertEqualInt(6, archive_entry_size(ae));
	assertEqualInt(0, archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt(6, (int)size);
	assertEqualInt(0, offset);
	assertEqualMem(p, "hello\n", 6);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Second name for the same regular file (this happens to be
	 * returned second, so does get marked as a hardlink). */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("hardlink", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualString(pathname, archive_entry_hardlink(ae));
	assert(!archive_entry_size_is_set(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}